

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharing.c
# Opt level: O0

void platform_ssh_share_cleanup(char *name)

{
  char *local_28;
  char *logtext;
  char *filename;
  char *dirname;
  char *name_local;
  
  dirname = name;
  filename = make_dirname(name,&local_28);
  if (filename == (char *)0x0) {
    safefree(local_28);
  }
  else {
    logtext = dupcat_fn(filename,"/socket",0);
    remove(logtext);
    safefree(logtext);
    logtext = dupcat_fn(filename,"/lock",0);
    remove(logtext);
    safefree(logtext);
    rmdir(filename);
    safefree(filename);
  }
  return;
}

Assistant:

void platform_ssh_share_cleanup(const char *name)
{
    char *dirname, *filename, *logtext;

    dirname = make_dirname(name, &logtext);
    if (!dirname) {
        sfree(logtext);                /* we can't do much with this */
        return;
    }

    filename = dupcat(dirname, "/socket");
    remove(filename);
    sfree(filename);

    filename = dupcat(dirname, "/lock");
    remove(filename);
    sfree(filename);

    rmdir(dirname);

    /*
     * We deliberately _don't_ clean up the parent directory
     * /tmp/putty-connshare.<username>, because if we leave it around
     * then it reduces the ability for other users to be a nuisance by
     * putting their own directory in the way of it. Also, the salt
     * file in it can be reused.
     */

    sfree(dirname);
}